

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
hta::detail::
make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator()(make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,stringstream *msg,char *arg,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  size_t sVar2;
  ostream *poVar3;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  poVar3 = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,arg,sVar2);
  }
  pcVar1 = (args->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + args->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }